

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Min::forward_impl
          (Min *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  Tensor t;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x2;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x1;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> y;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffdf8;
  Dim *d;
  Tensor *in_stack_fffffffffffffe10;
  Tensor *in_stack_fffffffffffffe18;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe20;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe28;
  Dim local_a8 [4];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_10 = in_RSI;
  Tensor::vec(in_stack_fffffffffffffe18);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
  Tensor::vec(in_stack_fffffffffffffe18);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,1);
  Tensor::vec(in_stack_fffffffffffffe18);
  d = local_a8;
  Tensor::Tensor(in_stack_fffffffffffffe10,d,(float *)in_RDI);
  Tensor::vec(in_stack_fffffffffffffe18);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *)d
       );
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *)d
       );
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>>
  ::operator<((ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffffe28,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffffe20);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  ::matrix((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
            *)d);
  Eigen::
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  ::cast<float>((DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                 *)in_stack_fffffffffffffe18);
  Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            (in_RDI,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,_float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffdf8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
  cwiseMin<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            (in_RDI,in_stack_fffffffffffffdf8);
  Tensor::~Tensor((Tensor *)0x60938e);
  return;
}

Assistant:

void Min::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Min not yet implemented for CUDA");
#else
  auto y = fx.vec();
  auto x1 = xs[0]->vec();
  auto x2 = xs[1]->vec();
  Tensor t(fx.d, static_cast<float*>(aux_mem));
  auto u = t.vec();
  u = (x1.array() < x2.array()).matrix().cast<float>();
  y = x1.cwiseMin(x2);
#endif
}